

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client.c
# Opt level: O0

int ssl_write_client_hello_body
              (mbedtls_ssl_context *ssl,uchar *buf,uchar *end,size_t *out_len,size_t *binders_len)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  int local_74;
  int write_sig_alg_ext;
  int ssl_write_supported_groups_ext_flags;
  uint8_t cookie_len;
  uchar propose_tls12;
  uchar *puStack_68;
  int tls12_uses_ec;
  size_t extensions_len;
  size_t output_len;
  uchar *p_extensions_len;
  uchar *p;
  mbedtls_ssl_handshake_params *handshake;
  size_t *psStack_38;
  int ret;
  size_t *binders_len_local;
  size_t *out_len_local;
  uchar *end_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  p = &ssl->handshake->resume;
  ssl_write_supported_groups_ext_flags = 0;
  *out_len = 0;
  *binders_len = 0;
  bVar1 = false;
  if (((mbedtls_ssl_handshake_params *)p)->min_tls_version < MBEDTLS_SSL_VERSION_TLS1_3) {
    bVar1 = 0x302 < ssl->tls_version;
  }
  p_extensions_len = buf;
  psStack_38 = binders_len;
  binders_len_local = out_len;
  out_len_local = (size_t *)end;
  end_local = buf;
  buf_local = (uchar *)ssl;
  iVar2 = mbedtls_ssl_chk_buf_ptr(buf,end,2);
  if (iVar2 == 0) {
    mbedtls_ssl_write_version
              (p_extensions_len,(uint)*(byte *)(*(long *)buf_local + 9),MBEDTLS_SSL_VERSION_TLS1_2);
    p_extensions_len = p_extensions_len + 2;
    iVar2 = mbedtls_ssl_chk_buf_ptr(p_extensions_len,(uint8_t *)out_len_local,0x20);
    if (iVar2 == 0) {
      *(undefined8 *)p_extensions_len = *(undefined8 *)(p + 0x510);
      *(undefined8 *)(p_extensions_len + 8) = *(undefined8 *)(p + 0x518);
      *(undefined8 *)(p_extensions_len + 0x10) = *(undefined8 *)(p + 0x520);
      *(undefined8 *)(p_extensions_len + 0x18) = *(undefined8 *)(p + 0x528);
      mbedtls_debug_print_buf
                ((mbedtls_ssl_context *)buf_local,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                 ,0x1e7,"client hello, random bytes",p_extensions_len,0x20);
      p_extensions_len = p_extensions_len + 0x20;
      iVar2 = mbedtls_ssl_chk_buf_ptr
                        (p_extensions_len,(uint8_t *)out_len_local,
                         *(long *)(*(long *)(buf_local + 0x60) + 0x10) + 1);
      if (iVar2 == 0) {
        puVar3 = p_extensions_len + 1;
        *p_extensions_len = (uchar)*(undefined8 *)(*(long *)(buf_local + 0x60) + 0x10);
        p_extensions_len = puVar3;
        memcpy(puVar3,(void *)(*(long *)(buf_local + 0x60) + 0x18),
               *(size_t *)(*(long *)(buf_local + 0x60) + 0x10));
        p_extensions_len = p_extensions_len + *(long *)(*(long *)(buf_local + 0x60) + 0x10);
        mbedtls_debug_print_buf
                  ((mbedtls_ssl_context *)buf_local,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                   ,0x200,"session id",(uchar *)(*(long *)(buf_local + 0x60) + 0x18),
                   *(size_t *)(*(long *)(buf_local + 0x60) + 0x10));
        if (*(char *)(*(long *)buf_local + 9) == '\x01') {
          write_sig_alg_ext._2_1_ = 0;
          if (*(long *)(p + 0x470) != 0) {
            mbedtls_debug_print_buf
                      ((mbedtls_ssl_context *)buf_local,3,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                       ,0x212,"client hello, cookie",*(uchar **)(p + 0x470),(ulong)p[0x478]);
            write_sig_alg_ext._2_1_ = p[0x478];
          }
          iVar2 = mbedtls_ssl_chk_buf_ptr
                            (p_extensions_len,(uint8_t *)out_len_local,
                             (long)(int)(write_sig_alg_ext._2_1_ + 1));
          if (iVar2 != 0) {
            return -0x6a00;
          }
          puVar3 = p_extensions_len + 1;
          *p_extensions_len = write_sig_alg_ext._2_1_;
          p_extensions_len = puVar3;
          if (write_sig_alg_ext._2_1_ != 0) {
            memcpy(puVar3,*(void **)(p + 0x470),(ulong)write_sig_alg_ext._2_1_);
            p_extensions_len = p_extensions_len + (int)(uint)write_sig_alg_ext._2_1_;
          }
        }
        handshake._4_4_ =
             ssl_write_client_hello_cipher_suites
                       ((mbedtls_ssl_context *)buf_local,p_extensions_len,(uchar *)out_len_local,
                        &ssl_write_supported_groups_ext_flags,&extensions_len);
        ssl_local._4_4_ = handshake._4_4_;
        if (handshake._4_4_ == 0) {
          p_extensions_len = p_extensions_len + extensions_len;
          iVar2 = mbedtls_ssl_chk_buf_ptr(p_extensions_len,(uint8_t *)out_len_local,2);
          if (iVar2 == 0) {
            puVar3 = p_extensions_len + 1;
            *p_extensions_len = '\x01';
            p_extensions_len = p_extensions_len + 2;
            *puVar3 = '\0';
            iVar2 = mbedtls_ssl_chk_buf_ptr(p_extensions_len,(uint8_t *)out_len_local,2);
            if (iVar2 == 0) {
              output_len = (size_t)p_extensions_len;
              p_extensions_len = p_extensions_len + 2;
              local_74 = 0;
              if ((bVar1) && (ssl_write_supported_groups_ext_flags != 0)) {
                local_74 = 1;
              }
              if (local_74 != 0) {
                iVar2 = ssl_write_supported_groups_ext
                                  ((mbedtls_ssl_context *)buf_local,p_extensions_len,
                                   (uchar *)out_len_local,local_74,&extensions_len);
                if (iVar2 != 0) {
                  return iVar2;
                }
                p_extensions_len = p_extensions_len + extensions_len;
                handshake._4_4_ = 0;
              }
              if (bVar1) {
                iVar2 = mbedtls_ssl_write_sig_alg_ext
                                  ((mbedtls_ssl_context *)buf_local,p_extensions_len,
                                   (uchar *)out_len_local,&extensions_len);
                if (iVar2 != 0) {
                  return iVar2;
                }
                p_extensions_len = p_extensions_len + extensions_len;
                handshake._4_4_ = 0;
              }
              if (bVar1) {
                iVar2 = mbedtls_ssl_tls12_write_client_hello_exts
                                  ((mbedtls_ssl_context *)buf_local,p_extensions_len,
                                   (uchar *)out_len_local,ssl_write_supported_groups_ext_flags,
                                   &extensions_len);
                if (iVar2 != 0) {
                  return iVar2;
                }
                p_extensions_len = p_extensions_len + extensions_len;
                handshake._4_4_ = 0;
              }
              puStack_68 = p_extensions_len + (-2 - output_len);
              if (puStack_68 == (uchar *)0x0) {
                p_extensions_len = (uchar *)output_len;
              }
              else {
                mbedtls_put_unaligned_uint16
                          ((void *)output_len,(ushort)puStack_68 << 8 | (ushort)puStack_68 >> 8);
                mbedtls_debug_print_msg
                          ((mbedtls_ssl_context *)buf_local,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                           ,0x2b1,"client hello, total extension length: %zu",puStack_68);
                mbedtls_debug_print_buf
                          ((mbedtls_ssl_context *)buf_local,3,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                           ,0x2b3,"client hello extensions",(uchar *)output_len,(size_t)puStack_68);
              }
              *binders_len_local = (long)p_extensions_len - (long)end_local;
              ssl_local._4_4_ = 0;
            }
            else {
              ssl_local._4_4_ = -0x6a00;
            }
          }
          else {
            ssl_local._4_4_ = -0x6a00;
          }
        }
      }
      else {
        ssl_local._4_4_ = -0x6a00;
      }
    }
    else {
      ssl_local._4_4_ = -0x6a00;
    }
  }
  else {
    ssl_local._4_4_ = -0x6a00;
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_write_client_hello_body(mbedtls_ssl_context *ssl,
                                       unsigned char *buf,
                                       unsigned char *end,
                                       size_t *out_len,
                                       size_t *binders_len)
{
    int ret;
    mbedtls_ssl_handshake_params *handshake = ssl->handshake;
    unsigned char *p = buf;
    unsigned char *p_extensions_len; /* Pointer to extensions length */
    size_t output_len;               /* Length of buffer used by function */
    size_t extensions_len;           /* Length of the list of extensions*/
    int tls12_uses_ec = 0;

    *out_len = 0;
    *binders_len = 0;

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    unsigned char propose_tls12 =
        (handshake->min_tls_version <= MBEDTLS_SSL_VERSION_TLS1_2)
        &&
        (MBEDTLS_SSL_VERSION_TLS1_2 <= ssl->tls_version);
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    unsigned char propose_tls13 =
        (handshake->min_tls_version <= MBEDTLS_SSL_VERSION_TLS1_3)
        &&
        (MBEDTLS_SSL_VERSION_TLS1_3 <= ssl->tls_version);
#endif

    /*
     * Write client_version (TLS 1.2) or legacy_version (TLS 1.3)
     *
     * In all cases this is the TLS 1.2 version.
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
    mbedtls_ssl_write_version(p, ssl->conf->transport,
                              MBEDTLS_SSL_VERSION_TLS1_2);
    p += 2;

    /* ...
     * Random random;
     * ...
     *
     * The random bytes have been prepared by ssl_prepare_client_hello() into
     * the handshake->randbytes buffer and are copied here into the output
     * buffer.
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, MBEDTLS_CLIENT_HELLO_RANDOM_LEN);
    memcpy(p, handshake->randbytes, MBEDTLS_CLIENT_HELLO_RANDOM_LEN);
    MBEDTLS_SSL_DEBUG_BUF(3, "client hello, random bytes",
                          p, MBEDTLS_CLIENT_HELLO_RANDOM_LEN);
    p += MBEDTLS_CLIENT_HELLO_RANDOM_LEN;

    /* TLS 1.2:
     * ...
     * SessionID session_id;
     * ...
     * with
     * opaque SessionID<0..32>;
     *
     * TLS 1.3:
     * ...
     * opaque legacy_session_id<0..32>;
     * ...
     *
     * The (legacy) session identifier bytes have been prepared by
     * ssl_prepare_client_hello() into the ssl->session_negotiate->id buffer
     * and are copied here into the output buffer.
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, ssl->session_negotiate->id_len + 1);
    *p++ = (unsigned char) ssl->session_negotiate->id_len;
    memcpy(p, ssl->session_negotiate->id, ssl->session_negotiate->id_len);
    p += ssl->session_negotiate->id_len;

    MBEDTLS_SSL_DEBUG_BUF(3, "session id", ssl->session_negotiate->id,
                          ssl->session_negotiate->id_len);

    /* DTLS 1.2 ONLY
     * ...
     * opaque cookie<0..2^8-1>;
     * ...
     */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2) && defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
#if !defined(MBEDTLS_SSL_PROTO_TLS1_3)
        uint8_t cookie_len = 0;
#else
        uint16_t cookie_len = 0;
#endif /* !MBEDTLS_SSL_PROTO_TLS1_3 */

        if (handshake->cookie != NULL) {
            MBEDTLS_SSL_DEBUG_BUF(3, "client hello, cookie",
                                  handshake->cookie,
                                  handshake->cookie_len);
            cookie_len = handshake->cookie_len;
        }

        MBEDTLS_SSL_CHK_BUF_PTR(p, end, cookie_len + 1);
        *p++ = (unsigned char) cookie_len;
        if (cookie_len > 0) {
            memcpy(p, handshake->cookie, cookie_len);
            p += cookie_len;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 && MBEDTLS_SSL_PROTO_DTLS */

    /* Write cipher_suites */
    ret = ssl_write_client_hello_cipher_suites(ssl, p, end,
                                               &tls12_uses_ec,
                                               &output_len);
    if (ret != 0) {
        return ret;
    }
    p += output_len;

    /* Write legacy_compression_methods (TLS 1.3) or
     * compression_methods (TLS 1.2)
     *
     * For every TLS 1.3 ClientHello, this vector MUST contain exactly
     * one byte set to zero, which corresponds to the 'null' compression
     * method in prior versions of TLS.
     *
     * For TLS 1.2 ClientHello, for security reasons we do not support
     * compression anymore, thus also just the 'null' compression method.
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
    *p++ = 1;
    *p++ = MBEDTLS_SSL_COMPRESS_NULL;

    /* Write extensions */

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    /* Keeping track of the included extensions */
    handshake->sent_extensions = MBEDTLS_SSL_EXT_MASK_NONE;
#endif

    /* First write extensions, then the total length */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
    p_extensions_len = p;
    p += 2;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    /* Write server name extension */
    ret = ssl_write_hostname_ext(ssl, p, end, &output_len);
    if (ret != 0) {
        return ret;
    }
    p += output_len;
#endif /* MBEDTLS_SSL_SERVER_NAME_INDICATION */

#if defined(MBEDTLS_SSL_ALPN)
    ret = ssl_write_alpn_ext(ssl, p, end, &output_len);
    if (ret != 0) {
        return ret;
    }
    p += output_len;
#endif /* MBEDTLS_SSL_ALPN */

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    if (propose_tls13) {
        ret = mbedtls_ssl_tls13_write_client_hello_exts(ssl, p, end,
                                                        &output_len);
        if (ret != 0) {
            return ret;
        }
        p += output_len;
    }
#endif

#if defined(MBEDTLS_SSL_TLS1_2_SOME_ECC) || \
    defined(MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED)
    {
        int ssl_write_supported_groups_ext_flags = 0;

#if defined(MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED)
        if (propose_tls13 && mbedtls_ssl_conf_tls13_some_ephemeral_enabled(ssl)) {
            ssl_write_supported_groups_ext_flags |=
                SSL_WRITE_SUPPORTED_GROUPS_EXT_TLS1_3_FLAG;
        }
#endif
#if defined(MBEDTLS_SSL_TLS1_2_SOME_ECC)
        if (propose_tls12 && tls12_uses_ec) {
            ssl_write_supported_groups_ext_flags |=
                SSL_WRITE_SUPPORTED_GROUPS_EXT_TLS1_2_FLAG;
        }
#endif
        if (ssl_write_supported_groups_ext_flags != 0) {
            ret = ssl_write_supported_groups_ext(ssl, p, end,
                                                 ssl_write_supported_groups_ext_flags,
                                                 &output_len);
            if (ret != 0) {
                return ret;
            }
            p += output_len;
        }
    }
#endif /* MBEDTLS_SSL_TLS1_2_SOME_ECC ||
          MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED */

#if defined(MBEDTLS_SSL_HANDSHAKE_WITH_CERT_ENABLED)
    int write_sig_alg_ext = 0;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    write_sig_alg_ext = write_sig_alg_ext ||
                        (propose_tls13 && mbedtls_ssl_conf_tls13_ephemeral_enabled(ssl));
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    write_sig_alg_ext = write_sig_alg_ext || propose_tls12;
#endif

    if (write_sig_alg_ext) {
        ret = mbedtls_ssl_write_sig_alg_ext(ssl, p, end, &output_len);
        if (ret != 0) {
            return ret;
        }
        p += output_len;
    }
#endif /* MBEDTLS_SSL_HANDSHAKE_WITH_CERT_ENABLED */

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if (propose_tls12) {
        ret = mbedtls_ssl_tls12_write_client_hello_exts(ssl, p, end,
                                                        tls12_uses_ec,
                                                        &output_len);
        if (ret != 0) {
            return ret;
        }
        p += output_len;
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

#if defined(MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_PSK_ENABLED)
    /* The "pre_shared_key" extension (RFC 8446 Section 4.2.11)
     * MUST be the last extension in the ClientHello.
     */
    if (propose_tls13 && mbedtls_ssl_conf_tls13_some_psk_enabled(ssl)) {
        ret = mbedtls_ssl_tls13_write_identities_of_pre_shared_key_ext(
            ssl, p, end, &output_len, binders_len);
        if (ret != 0) {
            return ret;
        }
        p += output_len;
    }
#endif /* MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_PSK_ENABLED */

    /* Write the length of the list of extensions. */
    extensions_len = p - p_extensions_len - 2;

    if (extensions_len == 0) {
        p = p_extensions_len;
    } else {
        MBEDTLS_PUT_UINT16_BE(extensions_len, p_extensions_len, 0);
        MBEDTLS_SSL_DEBUG_MSG(3, ("client hello, total extension length: %" \
                                  MBEDTLS_PRINTF_SIZET, extensions_len));
        MBEDTLS_SSL_DEBUG_BUF(3, "client hello extensions",
                              p_extensions_len, extensions_len);
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    MBEDTLS_SSL_PRINT_EXTS(
        3, MBEDTLS_SSL_HS_CLIENT_HELLO, handshake->sent_extensions);
#endif

    *out_len = p - buf;
    return 0;
}